

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-type.cpp
# Opt level: O0

Up __thiscall
yactfr::OptionalWithSignedIntegerSelectorType::_clone(OptionalWithSignedIntegerSelectorType *this)

{
  DataType *__fn;
  DataLocation *args_3;
  SelectorRangeSet *args_4;
  int in_ECX;
  void *__child_stack;
  OptionalWithIntegerSelectorType<long_long> *in_RSI;
  void *in_R8;
  undefined1 local_38 [8];
  DataLocation local_30;
  OptionalWithSignedIntegerSelectorType *this_local;
  
  this_local = this;
  local_30._pathElems.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
       CompoundDataType::minimumAlignment((CompoundDataType *)in_RSI);
  __fn = OptionalType::dataType(&in_RSI->super_OptionalType);
  DataType::clone((DataType *)(local_38 + 8),(__fn *)__fn,__child_stack,in_ECX,in_R8);
  args_3 = OptionalType::selectorLocation(&in_RSI->super_OptionalType);
  args_4 = OptionalWithIntegerSelectorType<long_long>::selectorRanges(in_RSI);
  DataType::attributes((DataType *)in_RSI);
  internal::tryCloneAttrs((MapItem *)local_38);
  create<unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation_const&,yactfr::IntegerRangeSet<long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)((long)&local_30._pathElems.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl + 8),
             (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             ((long)&local_30._pathElems.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl + 4),(DataLocation *)(local_38 + 8),
             (IntegerRangeSet<long_long,_true> *)args_3,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             args_4);
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::OptionalWithSignedIntegerSelectorType_const,std::default_delete<yactfr::OptionalWithSignedIntegerSelectorType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             (unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
              *)((long)&local_30._pathElems.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8));
  std::
  unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::OptionalWithSignedIntegerSelectorType,_std::default_delete<const_yactfr::OptionalWithSignedIntegerSelectorType>_>
                 *)((long)&local_30._pathElems.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8));
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_38);
  std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::~unique_ptr
            ((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             (local_38 + 8));
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up OptionalWithSignedIntegerSelectorType::_clone() const
{
    return OptionalWithSignedIntegerSelectorType::create(this->minimumAlignment(),
                                                         this->dataType().clone(),
                                                         this->selectorLocation(),
                                                         this->selectorRanges(),
                                                         internal::tryCloneAttrs(this->attributes()));
}